

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.cpp
# Opt level: O1

Result * __thiscall
CoreML::OneHotEncoder::getFeatureEncoding
          (Result *__return_storage_ptr__,OneHotEncoder *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *container)

{
  Model *this_00;
  OneHotEncoder *pOVar1;
  StringVector *pSVar2;
  Type *__x;
  int i;
  int index;
  
  this_00 = (this->super_Model).m_spec.
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00->_oneof_case_[0] != 600) {
    Specification::Model::clear_Type(this_00);
    this_00->_oneof_case_[0] = 600;
    pOVar1 = (OneHotEncoder *)operator_new(0x28);
    Specification::OneHotEncoder::OneHotEncoder(pOVar1);
    (this_00->Type_).onehotencoder_ = pOVar1;
  }
  pOVar1 = (this_00->Type_).onehotencoder_;
  index = 0;
  while( true ) {
    if (pOVar1->_oneof_case_[0] == 1) {
      pSVar2 = (StringVector *)(pOVar1->CategoryType_).int64categories_;
    }
    else {
      pSVar2 = Specification::StringVector::default_instance();
    }
    if ((pSVar2->vector_).super_RepeatedPtrFieldBase.current_size_ <= index) break;
    if (pOVar1->_oneof_case_[0] == 1) {
      pSVar2 = (pOVar1->CategoryType_).stringcategories_;
    }
    else {
      pSVar2 = Specification::StringVector::default_instance();
    }
    __x = google::protobuf::internal::RepeatedPtrFieldBase::
          Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                    (&(pSVar2->vector_).super_RepeatedPtrFieldBase,index);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(container,__x);
    index = index + 1;
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result OneHotEncoder::getFeatureEncoding(std::vector<std::string>& container) {
        auto *ohe = m_spec->mutable_onehotencoder();
        
        for (int i = 0; i < ohe->stringcategories().vector_size(); i++) {
            container.push_back(ohe->stringcategories().vector(i));
        }
        return Result();
    }